

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::TimestampTestParam::generateTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  uint *puVar2;
  long *in_RCX;
  uint *puVar3;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Record timestamp after ","");
  puVar3 = *(uint **)((long)this + 8);
  puVar2 = *(uint **)((long)this + 0x10);
  if (puVar3 != puVar2) {
    do {
      if (*puVar3 != 1) {
        getPipelineStageFlagStr_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)*puVar3,
                   VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,SUB81(in_RCX,0));
        plVar1 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_50,local_50._M_string_length,0,'\x01');
        in_RCX = plVar1 + 2;
        if ((long *)*plVar1 == in_RCX) {
          local_60 = *in_RCX;
          lStack_58 = plVar1[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *in_RCX;
          local_70 = (long *)*plVar1;
        }
        *plVar1 = (long)in_RCX;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        puVar2 = *(uint **)((long)this + 0x10);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string TimestampTestParam::generateTestDescription(void) const
{
	std::string result("Record timestamp after ");

	for (StageFlagVector::const_iterator it = m_stageVec.begin(); it != m_stageVec.end(); it++)
	{
		if(*it != VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT)
		{
			result += getPipelineStageFlagStr(*it, true) + ' ';
		}
	}
	if(m_inRenderPass)
		result += " in the renderpass";
	else
		result += " out of the render pass";

	return result;
}